

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O3

int __thiscall IRCCommand::getAccessLevel(IRCCommand *this,Channel *channel)

{
  int iVar1;
  pointer pCVar2;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  pointer pCVar6;
  pointer pTVar7;
  int *piVar8;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  
  pCVar6 = (this->m_channels).
           super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_channels).
           super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar2) {
    piVar8 = &pCVar6->access;
    do {
      rhs = (basic_string_view<char,_std::char_traits<char>_>)
            Jupiter::IRC::Client::Channel::getName();
      lhs._M_str = (((ChannelAccessPair *)(piVar8 + -8))->channel)._M_dataplus._M_p;
      lhs._M_len = *(size_type *)(piVar8 + -6);
      bVar4 = jessilib::equalsi<char,char>(lhs,rhs);
      if (bVar4) goto LAB_0010c3e0;
      pCVar6 = (pointer)(piVar8 + 2);
      piVar8 = piVar8 + 10;
    } while (pCVar6 != pCVar2);
  }
  pTVar7 = (this->m_types).
           super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->m_types).
           super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pTVar7 == pTVar3) {
      piVar8 = &this->m_access;
LAB_0010c3e0:
      return *piVar8;
    }
    iVar1 = pTVar7->type;
    iVar5 = Jupiter::IRC::Client::Channel::getType();
    if (iVar1 == iVar5) {
      piVar8 = &pTVar7->access;
      goto LAB_0010c3e0;
    }
    pTVar7 = pTVar7 + 1;
  } while( true );
}

Assistant:

int IRCCommand::getAccessLevel(Jupiter::IRC::Client::Channel *channel) {
	for (const auto& pair : m_channels) {
		if (jessilib::equalsi(pair.channel, channel->getName())) {
			return pair.access;
		}
	}

	for (const auto& pair : m_types) {
		if (pair.type == channel->getType()) {
			return pair.access;
		}
	}

	return m_access;
}